

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

string * hash_V5(string *__return_storage_ptr__,string *password,string *salt,string *udata,
                EncryptionData *data)

{
  byte bVar1;
  int bits;
  uint uVar2;
  uchar *iv;
  byte *pbVar3;
  uint uVar4;
  uint i;
  long lVar5;
  bool bVar6;
  string K;
  string E;
  string K1;
  Pl_SHA2 hash;
  string local_98;
  Pl_SHA2 sha2;
  
  Pl_SHA2::Pl_SHA2(&hash,0x100,(Pipeline *)0x0);
  Pipeline::writeString(&hash.super_Pipeline,password);
  Pipeline::writeString(&hash.super_Pipeline,salt);
  Pipeline::writeString(&hash.super_Pipeline,udata);
  Pl_SHA2::finish(&hash);
  Pl_SHA2::getRawDigest_abi_cxx11_(&K,&hash);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (data->R < 6) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    bVar6 = false;
    uVar2 = 0;
    while (!bVar6) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sha2,
                     password,&K);
      std::operator+(&K1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sha2,
                     udata);
      std::__cxx11::string::~string((string *)&sha2);
      if (K._M_string_length < 0x20) {
        __assert_fail("K.length() >= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDF_encryption.cc"
                      ,0x114,
                      "std::string hash_V5(const std::string &, const std::string &, const std::string &, const QPDF::EncryptionData &)"
                     );
      }
      std::__cxx11::string::substr((ulong)&sha2,(ulong)&K);
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&K);
      iv = QUtil::unsigned_char_pointer(&local_98);
      process_with_aes(&E,(string *)&sha2,true,&K1,0,0x40,iv,0x10);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&sha2);
      uVar4 = 0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        pbVar3 = (byte *)std::__cxx11::string::at((ulong)&E);
        uVar4 = uVar4 + *pbVar3;
      }
      bits = (uint)(uVar4 % 3 != 1) * 0x80 + 0x180;
      if (uVar4 % 3 == 0) {
        bits = 0x100;
      }
      Pl_SHA2::Pl_SHA2(&sha2,bits,(Pipeline *)0x0);
      Pipeline::writeString(&sha2.super_Pipeline,&E);
      Pl_SHA2::finish(&sha2);
      Pl_SHA2::getRawDigest_abi_cxx11_(&local_98,&sha2);
      std::__cxx11::string::operator=((string *)&K,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (uVar2 < 0x3f) {
        bVar6 = false;
      }
      else {
        bVar1 = E._M_dataplus._M_p[E._M_string_length - 1];
        local_98._M_dataplus._M_p._0_4_ = uVar2 - 0x1f;
        uVar4 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert((int *)&local_98);
        bVar6 = bVar1 <= uVar4;
      }
      Pl_SHA2::~Pl_SHA2(&sha2);
      std::__cxx11::string::~string((string *)&E);
      std::__cxx11::string::~string((string *)&K1);
      uVar2 = uVar2 + 1;
    }
    std::__cxx11::string::substr((ulong)&sha2,(ulong)&K);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sha2);
    std::__cxx11::string::~string((string *)&sha2);
  }
  std::__cxx11::string::~string((string *)&K);
  Pl_SHA2::~Pl_SHA2(&hash);
  return __return_storage_ptr__;
}

Assistant:

static std::string
hash_V5(
    std::string const& password,
    std::string const& salt,
    std::string const& udata,
    QPDF::EncryptionData const& data)
{
    Pl_SHA2 hash(256);
    hash.writeString(password);
    hash.writeString(salt);
    hash.writeString(udata);
    hash.finish();
    std::string K = hash.getRawDigest();

    std::string result;
    if (data.getR() < 6) {
        result = K;
    } else {
        // Algorithm 2.B from ISO 32000-1 chapter 7: Computing a hash

        int round_number = 0;
        bool done = false;
        while (!done) {
            // The hash algorithm has us setting K initially to the R5 value and then repeating a
            // series of steps 64 times before starting with the termination case testing.  The
            // wording of the specification is very unclear as to the exact number of times it
            // should be run since the wording about whether the initial setup counts as round 0 or
            // not is ambiguous.  This code counts the initial setup (R5) value as round 0, which
            // appears to be correct.  This was determined to be correct by increasing or decreasing
            // the number of rounds by 1 or 2 from this value and generating 20 test files.  In this
            // interpretation, all the test files worked with Adobe Reader X.  In the other
            // configurations, many of the files did not work, and we were accurately able to
            // predict which files didn't work by looking at the conditions under which we
            // terminated repetition.

            ++round_number;
            std::string K1 = password + K + udata;
            qpdf_assert_debug(K.length() >= 32);
            std::string E = process_with_aes(
                K.substr(0, 16),
                true,
                K1,
                0,
                64,
                QUtil::unsigned_char_pointer(K.substr(16, 16)),
                16);

            // E_mod_3 is supposed to be mod 3 of the first 16 bytes of E taken as as a (128-bit)
            // big-endian number.  Since (xy mod n) is equal to ((x mod n) + (y mod n)) mod n and
            // since 256 mod n is 1, we can just take the sums of the the mod 3s of each byte to get
            // the same result.
            int E_mod_3 = 0;
            for (unsigned int i = 0; i < 16; ++i) {
                E_mod_3 += static_cast<unsigned char>(E.at(i));
            }
            E_mod_3 %= 3;
            int next_hash = ((E_mod_3 == 0) ? 256 : (E_mod_3 == 1) ? 384 : 512);
            Pl_SHA2 sha2(next_hash);
            sha2.writeString(E);
            sha2.finish();
            K = sha2.getRawDigest();

            if (round_number >= 64) {
                unsigned int ch = static_cast<unsigned char>(*(E.rbegin()));

                if (ch <= QIntC::to_uint(round_number - 32)) {
                    done = true;
                }
            }
        }
        result = K.substr(0, 32);
    }

    return result;
}